

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O0

void __thiscall
helics::Publication::Publication
          (Publication *this,ValueFederate *valueFed,string_view key,string_view type,
          string_view units)

{
  string_view name;
  string_view type_00;
  string_view name_00;
  bool bVar1;
  char *in_RDX;
  ValueFederate *in_RSI;
  undefined8 *in_RDI;
  char *in_R8;
  size_t in_R9;
  string_view in_stack_00000000;
  Publication *in_stack_00000010;
  Publication *pub;
  Publication *in_stack_ffffffffffffff28;
  Publication *pPVar2;
  Publication *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  ValueFederate *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  undefined8 *puVar3;
  
  puVar3 = in_RDI;
  Interface::Interface(&in_stack_ffffffffffffff30->super_Interface);
  *in_RDI = &PTR__Publication_0091b708;
  in_RDI[7] = 0;
  *(undefined4 *)(in_RDI + 8) = 0xffffffff;
  in_RDI[9] = 0;
  in_RDI[10] = 0xbff0000000000000;
  *(undefined4 *)(in_RDI + 0xb) = 0x62ae;
  *(undefined1 *)((long)in_RDI + 0x5c) = 0;
  *(undefined1 *)((long)in_RDI + 0x5d) = 0;
  in_RDI[0xc] = 0;
  CLI::std::
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ::variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
             *)0x2bdc93);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  std::shared_ptr<units::precise_unit>::shared_ptr((shared_ptr<units::precise_unit> *)0x2bdcbf);
  name._M_str = in_RDX;
  name._M_len = in_stack_ffffffffffffffb0;
  helics::ValueFederate::getPublication(in_stack_ffffffffffffffa8,name);
  bVar1 = Interface::isValid((Interface *)0x2bdd0d);
  if (bVar1) {
    operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  else {
    pPVar2 = (Publication *)in_stack_00000000._M_str;
    name_00._M_str = in_RDX;
    name_00._M_len = in_R9;
    type_00._M_str = in_R8;
    type_00._M_len = (size_t)puVar3;
    helics::ValueFederate::registerPublication(in_RSI,name_00,type_00,in_stack_00000000);
    operator=(in_stack_00000010,pPVar2);
  }
  return;
}

Assistant:

Publication::Publication(ValueFederate* valueFed,
                         std::string_view key,
                         std::string_view type,
                         std::string_view units)
{
    auto& pub = valueFed->getPublication(key);
    if (pub.isValid()) {
        operator=(pub);
    } else {
        operator=(valueFed->registerPublication(key, type, units));
    }
}